

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3355:22),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3355:22),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  ExceptionOr<kj::HttpClient::Response> depResult;
  ExceptionOrValue local_620;
  char local_4c0;
  undefined4 local_4b8;
  char *local_4b0;
  ArrayDisposer *pAStack_4a8;
  HttpHeaders *local_4a0;
  char *local_498;
  long *local_490;
  undefined1 local_488 [416];
  undefined1 local_2e8 [40];
  anon_union_16_2_a774ebf0_for_OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>_3
  local_2c0;
  ArrayDisposer *local_2b0;
  Disposer *local_2a8;
  Context *local_2a0;
  undefined1 local_298 [272];
  undefined1 local_188 [24];
  char *local_170;
  int iStack_168;
  Type TStack_164;
  char *local_160;
  size_t sStack_158;
  ArrayDisposer *local_150;
  Disposer *local_148;
  Context *local_140;
  undefined1 local_138 [264];
  
  local_620.exception.ptr.isSet = false;
  local_4c0 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_620);
  plVar6 = local_490;
  uVar5 = local_620.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_620.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_620.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_620.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_620.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_620.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_620.exception.ptr.field_1 + 0x50);
    local_188._0_8_ = local_620.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188._8_8_ = local_620.exception.ptr.field_1.value.ownFile.content.size_;
    local_188._16_8_ = local_620.exception.ptr.field_1.value.ownFile.content.disposer;
    local_620.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_620.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_170 = local_620.exception.ptr.field_1.value.file;
    iStack_168 = local_620.exception.ptr.field_1.value.line;
    TStack_164 = local_620.exception.ptr.field_1.value.type;
    local_160 = local_620.exception.ptr.field_1.value.description.content.ptr;
    sStack_158 = local_620.exception.ptr.field_1.value.description.content.size_;
    local_150 = local_620.exception.ptr.field_1.value.description.content.disposer;
    local_620.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_620.exception.ptr.field_1.value.description.content.size_ = 0;
    local_148 = local_620.exception.ptr.field_1.value.context.ptr.disposer;
    local_140 = local_620.exception.ptr.field_1.value.context.ptr.ptr;
    local_620.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_138,__src,0x104);
    local_2e8._0_8_ = uVar1;
    local_2e8._8_8_ = uVar2;
    local_2e8._16_8_ = local_620.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188._0_8_ = (char *)0x0;
    local_188._8_8_ = (char *)0x0;
    local_2e8._24_8_ = local_620.exception.ptr.field_1.value.file;
    local_2e8._32_8_ = local_620.exception.ptr.field_1._32_8_;
    local_2c0.forceAligned = (void *)uVar3;
    local_2c0._8_8_ = uVar4;
    local_2b0 = local_620.exception.ptr.field_1.value.description.content.disposer;
    local_160 = (char *)0x0;
    sStack_158 = 0;
    local_2a8 = local_620.exception.ptr.field_1.value.context.ptr.disposer;
    local_2a0 = (Context *)uVar5;
    local_140 = (Context *)0x0;
    memcpy(local_298,__src,0x104);
    local_488[0] = true;
    local_488._8_8_ = uVar1;
    local_488._16_8_ = uVar2;
    local_488._24_8_ = local_620.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8._0_8_ = (char *)0x0;
    local_2e8._8_8_ = (char *)0x0;
    local_488._32_8_ = local_620.exception.ptr.field_1.value.file;
    local_488._40_8_ = local_620.exception.ptr.field_1._32_8_;
    local_488._48_8_ = uVar3;
    local_488._56_8_ = uVar4;
    local_488._64_8_ = local_620.exception.ptr.field_1.value.description.content.disposer;
    local_2c0.forceAligned = (char *)0x0;
    local_2c0._8_8_ = (long *)0x0;
    local_488._72_8_ = local_620.exception.ptr.field_1.value.context.ptr.disposer;
    local_488._80_8_ = uVar5;
    local_2a0 = (Context *)0x0;
    memcpy(local_488 + 0x58,__src,0x104);
    local_488[0x160] = false;
    Exception::~Exception((Exception *)local_2e8);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)output,
               (ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_488);
    if (local_488[0x160] == true) {
      OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
                ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)
                 (local_488 + 0x188));
    }
    if (local_488[0] == true) {
      Exception::~Exception((Exception *)(local_488 + 8));
    }
    Exception::~Exception((Exception *)local_188);
  }
  else if (local_4c0 == '\x01') {
    local_188._8_8_ = local_498;
    local_490 = (long *)0x0;
    local_188._0_4_ = 1;
    local_2e8._0_4_ = local_4b8;
    local_2e8._8_8_ = local_4b0;
    local_2e8._16_8_ = pAStack_4a8;
    local_2e8._24_8_ = local_4a0;
    local_2e8._32_4_ = 1;
    local_2c0.forceAligned = local_498;
    local_2c0._8_8_ = plVar6;
    local_188._16_8_ = (ArrayDisposer *)0x0;
    OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
              ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)local_188);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr
              ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_488,
               (WebSocketResponse *)local_2e8);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=
              ((ExceptionOr<kj::HttpClient::WebSocketResponse> *)output,
               (ExceptionOr<kj::HttpClient::WebSocketResponse> *)local_488);
    if (local_488[0x160] == true) {
      OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
                ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)
                 (local_488 + 0x188));
    }
    if (local_488[0] == true) {
      Exception::~Exception((Exception *)(local_488 + 8));
    }
    OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
              ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_2e8 + 0x20));
  }
  plVar6 = local_490;
  if ((local_4c0 == '\x01') && (local_490 != (long *)0x0)) {
    local_490 = (long *)0x0;
    (*(code *)**(undefined8 **)local_498)(local_498,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  if (local_620.exception.ptr.isSet == true) {
    Exception::~Exception(&local_620.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }